

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dumpmode.c
# Opt level: O3

int DumpModeDecode(TIFF *tif,uint8_t *buf,tmsize_t cc,uint16_t s)

{
  int iVar1;
  uint8_t *s_00;
  long lVar2;
  
  lVar2 = tif->tif_rawcc;
  if (lVar2 < cc) {
    iVar1 = 0;
    TIFFErrorExtR(tif,"DumpModeDecode",
                  "Not enough data for scanline %u, expected a request for at most %ld bytes, got a request for %ld bytes"
                  ,(ulong)tif->tif_row,lVar2,cc);
  }
  else {
    s_00 = tif->tif_rawcp;
    if (s_00 != buf) {
      _TIFFmemcpy(buf,s_00,cc);
      s_00 = tif->tif_rawcp;
      lVar2 = tif->tif_rawcc;
    }
    tif->tif_rawcp = s_00 + cc;
    tif->tif_rawcc = lVar2 - cc;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int DumpModeDecode(TIFF *tif, uint8_t *buf, tmsize_t cc, uint16_t s)
{
    static const char module[] = "DumpModeDecode";
    (void)s;
    if (tif->tif_rawcc < cc)
    {
        TIFFErrorExtR(tif, module,
                      "Not enough data for scanline %" PRIu32
                      ", expected a request for at most %" TIFF_SSIZE_FORMAT
                      " bytes, got a request for %" TIFF_SSIZE_FORMAT " bytes",
                      tif->tif_row, tif->tif_rawcc, cc);
        return (0);
    }
    /*
     * Avoid copy if client has setup raw
     * data buffer to avoid extra copy.
     */
    if (tif->tif_rawcp != buf)
        _TIFFmemcpy(buf, tif->tif_rawcp, cc);
    tif->tif_rawcp += cc;
    tif->tif_rawcc -= cc;
    return (1);
}